

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O2

void __thiscall
flatbuffers::lobster::LobsterGenerator::StructBuilderArgs
          (LobsterGenerator *this,StructDef *struct_def,char *nameprefix,string *code_ptr)

{
  FieldDef *name;
  StructDef *struct_def_00;
  pointer ppFVar1;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (ppFVar1 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar1 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar1 = ppFVar1 + 1) {
    name = *ppFVar1;
    if (((name->value).type.base_type == BASE_TYPE_STRUCT) &&
       (struct_def_00 = (name->value).type.struct_def, struct_def_00->fixed == true)) {
      EscapeKeyword(&local_b0,this,(string *)name);
      std::operator+(&local_90,&local_b0,"_");
      std::operator+(&local_f0,nameprefix,&local_90);
      StructBuilderArgs(this,struct_def_00,local_f0._M_dataplus._M_p,code_ptr);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_90);
      this_00 = &local_b0;
    }
    else {
      EscapeKeyword(&local_d0,this,(string *)name);
      std::operator+(&local_50,nameprefix,&local_d0);
      std::operator+(&local_b0,", ",&local_50);
      std::operator+(&local_90,&local_b0,":");
      LobsterType_abi_cxx11_(&local_70,this,&(name->value).type);
      std::operator+(&local_f0,&local_90,&local_70);
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      this_00 = &local_d0;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  return;
}

Assistant:

void StructBuilderArgs(const StructDef &struct_def, const char *nameprefix,
                         std::string *code_ptr) {
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (IsStruct(field.value.type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        StructBuilderArgs(*field.value.type.struct_def,
                          (nameprefix + (NormalizedName(field) + "_")).c_str(),
                          code_ptr);
      } else {
        std::string &code = *code_ptr;
        code += ", " + (nameprefix + NormalizedName(field)) + ":" +
                LobsterType(field.value.type);
      }
    }
  }